

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O2

int Bac_CommandCec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  Gia_Man_t *p;
  char *pcVar2;
  Vec_Ptr_t *vDes;
  Bac_Man_t *pBVar3;
  Gia_Man_t *p1;
  Gia_Man_t *pInit;
  int iVar4;
  char *__filename;
  Cec_ParCec_t ParsCec;
  
  pBVar3 = (Bac_Man_t *)pAbc->pAbcBac;
  Cec_ManCecSetDefaultParams(&ParsCec);
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    ParsCec.fVerbose = ParsCec.fVerbose ^ 1;
  }
  if (iVar1 != -1) {
    iVar1 = -2;
    Abc_Print(-2,"usage: @_cec [-vh]\n");
    Abc_Print(-2,"\t         combinational equivalence checking\n");
    pcVar2 = "yes";
    if (ParsCec.fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
    pcVar2 = "\t-h     : print the command usage\n";
LAB_0033a238:
    Abc_Print(iVar1,pcVar2);
    return 1;
  }
  if (pBVar3 != (Bac_Man_t *)0x0) {
    if (argc - globalUtilOptind == 1) {
      pcVar2 = argv[globalUtilOptind];
      __filename = pcVar2;
    }
    else {
      pcVar2 = pBVar3->pSpec;
      __filename = pcVar2;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = "File name is not given on the command line.\n";
        iVar1 = -1;
        goto LAB_0033a238;
      }
    }
    do {
      if (*pcVar2 == '>') {
        *pcVar2 = '\\';
      }
      else if (*pcVar2 == '\0') goto LAB_0033a27d;
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  pcVar2 = "Bac_CommandCec(): There is no current design.\n";
  iVar1 = 1;
LAB_0033a40f:
  iVar4 = 0;
LAB_0033a410:
  Abc_Print(iVar1,pcVar2);
  return iVar4;
LAB_0033a27d:
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
    pcVar2 = Extra_FileGetSimilarName(__filename,".v",".blif",(char *)0x0,(char *)0x0,(char *)0x0);
    if (pcVar2 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar2);
    }
    pcVar2 = "\n";
    iVar1 = 1;
    iVar4 = iVar1;
    goto LAB_0033a410;
  }
  fclose(__stream);
  p = Bac_ManExtract(pBVar3,0,0);
  if (p == (Gia_Man_t *)0x0) {
    pcVar2 = "Extracting AIG from the current design has failed.\n";
  }
  else {
    pcVar2 = Extra_FileNameExtension(__filename);
    iVar1 = strcmp(pcVar2,"blif");
    if (iVar1 == 0) {
      vDes = Psr_ManReadBlif(__filename);
    }
    else {
      pcVar2 = Extra_FileNameExtension(__filename);
      if ((*pcVar2 != 'v') || (pcVar2[1] != '\0')) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacCom.c"
                      ,0x27c,"int Bac_CommandCec(Abc_Frame_t *, int, char **)");
      }
      vDes = Psr_ManReadVerilog(__filename);
    }
    pBVar3 = Psr_ManBuildCba(__filename,vDes);
    Psr_ManVecFree(vDes);
    p1 = Bac_ManExtract(pBVar3,0,0);
    Bac_ManFree(pBVar3);
    if (p1 != (Gia_Man_t *)0x0) {
      pInit = Gia_ManMiter(p,p1,0,1,0,0,ParsCec.fVerbose);
      if (pInit != (Gia_Man_t *)0x0) {
        iVar1 = Cec_ManVerify(pInit,&ParsCec);
        pAbc->Status = iVar1;
        Gia_ManStop(pInit);
      }
      Gia_ManStop(p);
      Gia_ManStop(p1);
      return 0;
    }
    Gia_ManStop(p);
    pcVar2 = "Extracting AIG from the original design has failed.\n";
  }
  iVar1 = -1;
  goto LAB_0033a40f;
}

Assistant:

int Bac_CommandCec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    Gia_Man_t * pFirst, * pSecond, * pMiter;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    Vec_Ptr_t * vDes;
    char * FileName, * pStr, ** pArgvNew;
    int c, nArgcNew, fDumpMiter = 0;
    FILE * pFile;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandCec(): There is no current design.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( p->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = p->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pStr = FileName; *pStr; pStr++ )
        if ( *pStr == '>' )
            *pStr = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".v", ".blif", NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    // extract AIG from the current design
    pFirst = Bac_ManExtract( p, 0, 0 );
    if ( pFirst == NULL )
    {
        Abc_Print( -1, "Extracting AIG from the current design has failed.\n" );
        return 0;
    }
    // extract AIG from the second design
    if ( !strcmp( Extra_FileNameExtension(FileName), "blif" )  )
        vDes = Psr_ManReadBlif( FileName );
    else if ( !strcmp( Extra_FileNameExtension(FileName), "v" )  )
        vDes = Psr_ManReadVerilog( FileName );
    else assert( 0 );
    p = Psr_ManBuildCba( FileName, vDes );
    Psr_ManVecFree( vDes );
    pSecond = Bac_ManExtract( p, 0, 0 );
    Bac_ManFree( p );
    if ( pSecond == NULL )
    {
        Gia_ManStop( pFirst );
        Abc_Print( -1, "Extracting AIG from the original design has failed.\n" );
        return 0;
    }
    // compute the miter
    pMiter = Gia_ManMiter( pFirst, pSecond, 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        //Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pMiter );
    }
    Gia_ManStop( pFirst );
    Gia_ManStop( pSecond );
    return 0;
usage:
    Abc_Print( -2, "usage: @_cec [-vh]\n" );
    Abc_Print( -2, "\t         combinational equivalence checking\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}